

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# flatfile.cpp
# Opt level: O3

FILE * __thiscall FlatFileSeq::Open(FlatFileSeq *this,FlatFilePos *pos,bool read_only)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  long lVar2;
  char cVar3;
  int iVar4;
  FILE *__stream;
  char *__modes;
  long in_FS_OFFSET;
  string_view logging_function;
  string_view logging_function_00;
  string_view source_file;
  string_view source_file_00;
  path local_80;
  path path;
  
  lVar2 = *(long *)(in_FS_OFFSET + 0x28);
  if (pos->nFile == -1) {
    __stream = (FILE *)0x0;
    goto LAB_00455582;
  }
  FileName(&path,this,pos);
  std::filesystem::__cxx11::path::parent_path();
  cVar3 = std::filesystem::symlink_status(&local_80);
  if (cVar3 == '\x03') {
    cVar3 = std::filesystem::status(&local_80);
    if (cVar3 != '\x02') goto LAB_004553f6;
  }
  else {
LAB_004553f6:
    std::filesystem::create_directories(&local_80);
  }
  std::filesystem::__cxx11::path::~path(&local_80);
  __modes = "rb+";
  if (read_only) {
    __modes = "rb";
  }
  __stream = fsbridge::fopen((char *)&path,__modes);
  if (__stream == (FILE *)0x0 && !read_only) {
    __stream = fsbridge::fopen((char *)&path,"wb+");
  }
  if (__stream == (FILE *)0x0) {
    paVar1 = &local_80._M_pathname.field_2;
    local_80._M_pathname._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_80,path.super_path._M_pathname._M_dataplus._M_p,
               path.super_path._M_pathname._M_dataplus._M_p +
               path.super_path._M_pathname._M_string_length);
    logging_function_00._M_str = "Open";
    logging_function_00._M_len = 4;
    source_file_00._M_str =
         "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/flatfile.cpp"
    ;
    source_file_00._M_len = 0x5c;
    LogPrintFormatInternal<std::__cxx11::string>
              (logging_function_00,source_file_00,0x2c,ALL,Info,(ConstevalFormatString<1U>)0x816677,
               &local_80._M_pathname);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_80._M_pathname._M_dataplus._M_p != paVar1) {
      operator_delete(local_80._M_pathname._M_dataplus._M_p,
                      local_80._M_pathname.field_2._M_allocated_capacity + 1);
    }
LAB_00455575:
    __stream = (FILE *)0x0;
  }
  else if ((ulong)pos->nPos != 0) {
    iVar4 = fseek(__stream,(ulong)pos->nPos,0);
    if (iVar4 != 0) {
      paVar1 = &local_80._M_pathname.field_2;
      local_80._M_pathname._M_dataplus._M_p = (pointer)paVar1;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_80,path.super_path._M_pathname._M_dataplus._M_p,
                 path.super_path._M_pathname._M_dataplus._M_p +
                 path.super_path._M_pathname._M_string_length);
      logging_function._M_str = "Open";
      logging_function._M_len = 4;
      source_file._M_str =
           "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/flatfile.cpp"
      ;
      source_file._M_len = 0x5c;
      LogPrintFormatInternal<unsigned_int,std::__cxx11::string>
                (logging_function,source_file,0x30,ALL,Info,(ConstevalFormatString<2U>)0x81668f,
                 &pos->nPos,&local_80._M_pathname);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_80._M_pathname._M_dataplus._M_p != paVar1) {
        operator_delete(local_80._M_pathname._M_dataplus._M_p,
                        local_80._M_pathname.field_2._M_allocated_capacity + 1);
      }
      fclose(__stream);
      goto LAB_00455575;
    }
  }
  std::filesystem::__cxx11::path::~path(&path.super_path);
LAB_00455582:
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar2) {
    return (FILE *)__stream;
  }
  __stack_chk_fail();
}

Assistant:

FILE* FlatFileSeq::Open(const FlatFilePos& pos, bool read_only) const
{
    if (pos.IsNull()) {
        return nullptr;
    }
    fs::path path = FileName(pos);
    fs::create_directories(path.parent_path());
    FILE* file = fsbridge::fopen(path, read_only ? "rb": "rb+");
    if (!file && !read_only)
        file = fsbridge::fopen(path, "wb+");
    if (!file) {
        LogPrintf("Unable to open file %s\n", fs::PathToString(path));
        return nullptr;
    }
    if (pos.nPos && fseek(file, pos.nPos, SEEK_SET)) {
        LogPrintf("Unable to seek to position %u of %s\n", pos.nPos, fs::PathToString(path));
        fclose(file);
        return nullptr;
    }
    return file;
}